

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall
el::base::DefaultPerformanceTrackingCallback::handle
          (DefaultPerformanceTrackingCallback *this,PerformanceTrackingData *data)

{
  char **ppcVar1;
  PerformanceTrackingData *pPVar2;
  int iVar3;
  _func_int **pp_Var4;
  size_t sVar5;
  ostream *poVar6;
  ostream *poVar7;
  Writer *pWVar8;
  long lVar9;
  char *pcVar10;
  undefined1 *puVar11;
  stringstream_t ss;
  char *local_238;
  char local_228 [16];
  Writer local_218;
  stringstream local_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  this->m_data = data;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar6 = (ostream *)local_198;
  iVar3 = (int)poVar6;
  if (*(short *)(this->m_data + 0x28) == 2) {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Executed [",10);
    pcVar10 = *(char **)(*(long *)this->m_data + 0x18);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)*(undefined8 *)(local_198[0] + -0x18));
    }
    else {
      sVar5 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] in [",6);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar6,*(char **)(this->m_data + 8),*(long *)(this->m_data + 0x10));
    lVar9 = 1;
    pcVar10 = "]";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Performance checkpoint",0x16);
    ppcVar1 = &local_218.m_file;
    lVar9 = *(long *)(this->m_data + 0x30);
    local_218._vptr_Writer = (_func_int **)ppcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,lVar9,*(long *)(this->m_data + 0x38) + lVar9);
    if (local_218._vptr_Writer != (_func_int **)ppcVar1) {
      operator_delete(local_218._vptr_Writer);
    }
    if (CONCAT62(local_218._10_6_,local_218.m_level) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," [",2);
      lVar9 = *(long *)(this->m_data + 0x30);
      local_218._vptr_Writer = (_func_int **)ppcVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,lVar9,*(long *)(this->m_data + 0x38) + lVar9);
      pp_Var4 = local_218._vptr_Writer;
      if (local_218._vptr_Writer == (_func_int **)0x0) {
        std::ios::clear(iVar3 + (int)*(undefined8 *)(local_198[0] + -0x18));
      }
      else {
        sVar5 = strlen((char *)local_218._vptr_Writer);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)pp_Var4,sVar5);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"]",1);
      if (local_218._vptr_Writer != (_func_int **)ppcVar1) {
        operator_delete(local_218._vptr_Writer);
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6," for block [",0xc);
    pcVar10 = *(char **)(*(long *)this->m_data + 0x18);
    if (pcVar10 == (char *)0x0) {
      std::ios::clear(iVar3 + (int)*(undefined8 *)(local_198[0] + -0x18));
    }
    else {
      sVar5 = strlen(pcVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,"] : [",5);
    (**(code **)(*(long *)(*(long *)this->m_data + 0x10) + 0x10))
              (*(long *)this->m_data + 0x10,poVar6);
    lVar9 = 1;
    pcVar10 = "]";
    if (((*(byte *)(elStorage + 0x21) & 1) == 0) &&
       (*(char *)(*(long *)this->m_data + 100) == '\x01')) {
      std::__ostream_insert<char,std::char_traits<char>>(poVar6," ([",3);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar6,*(char **)(this->m_data + 8),*(long *)(this->m_data + 0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"] from ",7);
      if (*(long *)(*(long *)this->m_data + 0x70) == 0) {
        lVar9 = 0xf;
        pcVar10 = "last checkpoint";
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"checkpoint \'",0xc);
        pcVar10 = *(char **)(*(long *)this->m_data + 0x68);
        if (pcVar10 == (char *)0x0) {
          std::ios::clear(iVar3 + (int)*(undefined8 *)(local_198[0] + -0x18));
        }
        else {
          sVar5 = strlen(pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,sVar5);
        }
        lVar9 = 1;
        pcVar10 = "\'";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,lVar9);
      lVar9 = 2;
      pcVar10 = ")]";
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,pcVar10,lVar9);
  pPVar2 = this->m_data;
  local_218.m_level = *(Level *)(*(long *)pPVar2 + 0x62);
  local_218.m_file = *(char **)(pPVar2 + 0x50);
  local_218.m_line = *(unsigned_long *)(pPVar2 + 0x58);
  local_218.m_func = *(char **)(pPVar2 + 0x60);
  local_218._vptr_Writer = (_func_int **)&PTR__Writer_00129900;
  local_218.m_verboseLevel = 0;
  local_218.m_proceed = false;
  local_218.m_messageBuilder.m_logger = (Logger *)0x0;
  local_218.m_messageBuilder.m_containerLogSeperator = "";
  local_218.m_dispatchAction = NormalLog;
  local_218.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_218.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_218.m_loggerIds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pWVar8 = Writer::construct(&local_218,1,*(char **)(*(long *)pPVar2 + 0x40));
  std::__cxx11::stringbuf::str();
  if (pWVar8->m_proceed == true) {
    puVar11 = &((pWVar8->m_messageBuilder).m_logger)->field_0x50;
    if (local_238 == (char *)0x0) {
      std::ios::clear((int)puVar11 + (int)*(undefined8 *)(*(long *)puVar11 + -0x18));
    }
    else {
      sVar5 = strlen(local_238);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar11,local_238,sVar5);
    }
    if ((*(byte *)(elStorage + 0x21) & 0x20) != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((pWVar8->m_messageBuilder).m_logger)->field_0x50," ",1);
    }
  }
  if (local_238 != local_228) {
    operator_delete(local_238);
  }
  Writer::~Writer(&local_218);
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

void handle(const PerformanceTrackingData* data) {
        m_data = data;
        base::type::stringstream_t ss;
        if (m_data->dataType() == PerformanceTrackingData::DataType::Complete) {
            ss << ELPP_LITERAL("Executed [") << m_data->blockName()->c_str() << ELPP_LITERAL("] in [") << *m_data->formattedTimeTaken() << ELPP_LITERAL("]");
        } else {
            ss << ELPP_LITERAL("Performance checkpoint");
            if (!m_data->checkpointId().empty()) {
                ss << ELPP_LITERAL(" [") << m_data->checkpointId().c_str() << ELPP_LITERAL("]");
            }
            ss << ELPP_LITERAL(" for block [") << m_data->blockName()->c_str() << ELPP_LITERAL("] : [") << *m_data->performanceTracker();
            if (!ELPP->hasFlag(LoggingFlag::DisablePerformanceTrackingCheckpointComparison) && m_data->performanceTracker()->m_hasChecked) {
                ss << ELPP_LITERAL(" ([") << *m_data->formattedTimeTaken() << ELPP_LITERAL("] from ");
                if (m_data->performanceTracker()->m_lastCheckpointId.empty()) {
                    ss << ELPP_LITERAL("last checkpoint");
                } else {
                    ss << ELPP_LITERAL("checkpoint '") << m_data->performanceTracker()->m_lastCheckpointId.c_str() << ELPP_LITERAL("'");
                }
                ss << ELPP_LITERAL(")]");
            } else {
                ss << ELPP_LITERAL("]");
            }
        }
        el::base::Writer(m_data->performanceTracker()->level(), m_data->file(), m_data->line(), m_data->func()).construct(1, m_data->loggerId().c_str()) << ss.str();
    }